

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
::int_writer<int,_fmt::v5::basic_format_specs<char>_>::on_bin
          (int_writer<int,_fmt::v5::basic_format_specs<char>_> *this)

{
  char cVar1;
  basic_format_specs<char> *pbVar2;
  uint uVar3;
  bin_writer<1> f;
  string_view prefix;
  
  pbVar2 = this->spec;
  if ((pbVar2->flags_ & 8) != 0) {
    uVar3 = this->prefix_size;
    this->prefix_size = uVar3 + 1;
    this->prefix[uVar3] = '0';
    cVar1 = pbVar2->type_;
    uVar3 = this->prefix_size;
    this->prefix_size = uVar3 + 1;
    this->prefix[uVar3] = cVar1;
  }
  uVar3 = basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
          ::int_writer<int,fmt::v5::basic_format_specs<char>>::count_digits<1u>(this);
  f.num_digits = uVar3;
  f.abs_value = this->abs_value;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
  ::
  write_int<fmt::v5::basic_format_specs<char>,fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::bin_writer<1>>
            ((basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              *)this->writer,uVar3,prefix,this->spec,f);
  return;
}

Assistant:

void on_bin() {
      if (spec.flag(HASH_FLAG)) {
        prefix[prefix_size++] = '0';
        prefix[prefix_size++] = static_cast<char>(spec.type());
      }
      unsigned num_digits = count_digits<1>();
      writer.write_int(num_digits, get_prefix(), spec,
                       bin_writer<1>{abs_value, num_digits});
    }